

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::RemoveRPath(string *file,string *emsg,bool *removed)

{
  bool *pbVar1;
  bool bVar2;
  uint index;
  StringEntry *__tmp;
  StringEntry *pSVar3;
  StringEntry *pSVar4;
  ulong uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  long *plVar8;
  char *pcVar9;
  unsigned_long *puVar10;
  int i_1;
  pointer buf;
  StringEntry **ppSVar11;
  ulong uVar12;
  StringEntry *se [2];
  vector<char,_std::allocator<char>_> bytes;
  unsigned_long entryBegin [3];
  unsigned_long entryEnd [2];
  unsigned_long zeroSize [2];
  unsigned_long zeroPosition [2];
  ofstream f;
  value_type local_2c9;
  StringEntry *local_2c8 [2];
  vector<char,_std::allocator<char>_> local_2b8;
  unsigned_long local_298 [4];
  bool *local_278;
  string *local_270;
  unsigned_long local_268 [7];
  undefined1 local_230 [32];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  if (removed != (bool *)0x0) {
    *removed = false;
  }
  local_268[4] = 0;
  local_268[5] = 0;
  local_268[2] = 0;
  local_268[3] = 0;
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cmELF::cmELF((cmELF *)local_230,(file->_M_dataplus)._M_p);
  local_2c8[0] = (StringEntry *)0x0;
  local_2c8[1] = (StringEntry *)0x0;
  pSVar3 = cmELF::GetRPath((cmELF *)local_230);
  if (pSVar3 == (StringEntry *)0x0) {
    ppSVar11 = local_2c8;
  }
  else {
    ppSVar11 = local_2c8 + 1;
    local_2c8[0] = pSVar3;
  }
  pSVar4 = cmELF::GetRunPath((cmELF *)local_230);
  puVar10 = local_298 + 1;
  if (pSVar4 == (StringEntry *)0x0) {
    if (pSVar3 != (StringEntry *)0x0) goto LAB_00247de0;
    bVar2 = true;
  }
  else {
    *ppSVar11 = pSVar4;
    pSVar4 = local_2c8[0];
    if (pSVar3 == (StringEntry *)0x0) {
LAB_00247de0:
      uVar12 = 1;
    }
    else {
      puVar10 = local_298 + 2;
      uVar12 = 2;
      if (local_2c8[1]->IndexInSection < local_2c8[0]->IndexInSection) {
        local_2c8[0] = local_2c8[1];
        local_2c8[1] = pSVar4;
      }
    }
    index = cmELF::GetDynamicEntryCount((cmELF *)local_230);
    if (index != 0) {
      local_270 = file;
      local_278 = removed;
      uVar5 = 0;
      do {
        pSVar3 = local_2c8[uVar5];
        local_268[uVar5 + 4] = pSVar3->Position;
        local_268[uVar5 + 2] = pSVar3->Size;
        uVar5 = uVar5 + 1;
      } while (uVar12 != uVar5);
      local_298[0] = 0;
      local_298[1] = 0;
      local_298[2] = 0;
      local_268[0] = 0;
      local_268[1] = 0;
      uVar5 = 0;
      do {
        pSVar3 = local_2c8[uVar5];
        uVar6 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,pSVar3->IndexInSection);
        local_298[uVar5] = uVar6;
        uVar6 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,pSVar3->IndexInSection + 1);
        local_268[uVar5] = uVar6;
        uVar5 = uVar5 + 1;
      } while (uVar12 != uVar5);
      uVar7 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,index);
      uVar6 = local_298[0];
      *puVar10 = uVar7;
      local_2c9 = '\0';
      std::vector<char,_std::allocator<char>_>::resize(&local_2b8,uVar7 - local_298[0],&local_2c9);
      uVar5 = 0;
      buf = local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
      do {
        uVar7 = local_298[uVar5 + 1] - local_268[uVar5];
        if ((uVar7 != 0) &&
           (bVar2 = cmELF::ReadBytes((cmELF *)local_230,local_268[uVar5],uVar7,buf), !bVar2)) {
          if (emsg != (string *)0x0) {
            std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x4bfcc3);
          }
          cmELF::~cmELF((cmELF *)local_230);
          bVar2 = false;
          goto LAB_00248134;
        }
        uVar5 = uVar5 + 1;
        buf = buf + uVar7;
      } while (uVar12 != uVar5);
      cmELF::~cmELF((cmELF *)local_230);
      std::ofstream::ofstream(local_230,(local_270->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
      if ((abStack_210
           [(long)(((cmELFInternal *)(local_230._0_8_ + -0x58))->DynamicSectionStrings)._M_t._M_impl
                  .super__Rb_tree_header._M_header._M_left] & 5) == 0) {
        plVar8 = (long *)std::ostream::seekp(local_230,uVar6,0);
        if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) == 0) {
          plVar8 = (long *)std::ostream::write(local_230,
                                               (long)local_2b8.
                                                     super__Vector_base<char,_std::allocator<char>_>
                                                     ._M_impl.super__Vector_impl_data._M_start);
          if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) == 0) {
            bVar2 = true;
            uVar5 = 0;
            do {
              plVar8 = (long *)std::ostream::seekp((ostream *)local_230,local_268[uVar5 + 4],0);
              if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
                if (emsg != (string *)0x0) {
                  std::__cxx11::string::operator=((string *)emsg,"Error seeking to RPATH position.")
                  ;
                }
                goto LAB_002480f9;
              }
              pbVar1 = local_278;
              for (uVar6 = local_268[uVar5 + 2]; local_278 = pbVar1, uVar6 != 0; uVar6 = uVar6 - 1)
              {
                local_298[0] = local_298[0] & 0xffffffffffffff00;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,(char *)local_298,1);
                pbVar1 = local_278;
              }
              if ((abStack_210
                   [(long)(((cmELFInternal *)(local_230._0_8_ + -0x58))->DynamicSectionStrings)._M_t
                          ._M_impl.super__Rb_tree_header._M_header._M_left] & 5) != 0) {
                if (emsg != (string *)0x0) {
                  std::__cxx11::string::operator=
                            ((string *)emsg,"Error writing the empty rpath string to the file.");
                }
                goto LAB_0024817e;
              }
              uVar5 = uVar5 + 1;
              bVar2 = uVar5 < uVar12;
            } while (uVar5 != uVar12);
            bVar2 = false;
LAB_0024817e:
            if ((bool)(pbVar1 == (bool *)0x0 | bVar2)) {
              bVar2 = (bool)(bVar2 ^ 1);
            }
            else {
              *pbVar1 = true;
              bVar2 = true;
            }
            goto LAB_002480fc;
          }
          if (emsg != (string *)0x0) {
            pcVar9 = "Error replacing DYNAMIC table header.";
            goto LAB_00248041;
          }
        }
        else if (emsg != (string *)0x0) {
          pcVar9 = "Error seeking to DYNAMIC table header for RPATH.";
          goto LAB_00248041;
        }
LAB_002480f9:
        bVar2 = false;
      }
      else {
        if (emsg == (string *)0x0) goto LAB_002480f9;
        pcVar9 = "Error opening file for update.";
LAB_00248041:
        bVar2 = false;
        std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,(ulong)pcVar9)
        ;
      }
LAB_002480fc:
      local_230._0_8_ = _VTT;
      *(undefined8 *)
       (local_230 +
       (long)_VTT[-1].DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_left) =
           _getsockopt;
      std::filebuf::~filebuf((filebuf *)(local_230 + 8));
      std::ios_base::~ios_base(local_138);
      goto LAB_00248134;
    }
    if (emsg == (string *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = false;
      std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x4bfc90);
    }
  }
  cmELF::~cmELF((cmELF *)local_230);
LAB_00248134:
  if (local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool cmSystemTools::RemoveRPath(std::string const& file, std::string* emsg,
                                bool* removed)
{
#if defined(CMAKE_USE_ELF_PARSER)
  if(removed)
    {
    *removed = false;
    }
  int zeroCount = 0;
  unsigned long zeroPosition[2] = {0,0};
  unsigned long zeroSize[2] = {0,0};
  unsigned long bytesBegin = 0;
  std::vector<char> bytes;
  {
  // Parse the ELF binary.
  cmELF elf(file.c_str());

  // Get the RPATH and RUNPATH entries from it and sort them by index
  // in the dynamic section header.
  int se_count = 0;
  cmELF::StringEntry const* se[2] = {0, 0};
  if(cmELF::StringEntry const* se_rpath = elf.GetRPath())
    {
    se[se_count++] = se_rpath;
    }
  if(cmELF::StringEntry const* se_runpath = elf.GetRunPath())
    {
    se[se_count++] = se_runpath;
    }
  if(se_count == 0)
    {
    // There is no RPATH or RUNPATH anyway.
    return true;
    }
  if(se_count == 2 && se[1]->IndexInSection < se[0]->IndexInSection)
    {
    std::swap(se[0], se[1]);
    }

  // Get the size of the dynamic section header.
  unsigned int count = elf.GetDynamicEntryCount();
  if(count == 0)
    {
    // This should happen only for invalid ELF files where a DT_NULL
    // appears before the end of the table.
    if(emsg)
      {
      *emsg = "DYNAMIC section contains a DT_NULL before the end.";
      }
    return false;
    }

  // Save information about the string entries to be zeroed.
  zeroCount = se_count;
  for(int i=0; i < se_count; ++i)
    {
    zeroPosition[i] = se[i]->Position;
    zeroSize[i] = se[i]->Size;
    }

  // Get the range of file positions corresponding to each entry and
  // the rest of the table after them.
  unsigned long entryBegin[3] = {0,0,0};
  unsigned long entryEnd[2] = {0,0};
  for(int i=0; i < se_count; ++i)
    {
    entryBegin[i] = elf.GetDynamicEntryPosition(se[i]->IndexInSection);
    entryEnd[i] = elf.GetDynamicEntryPosition(se[i]->IndexInSection+1);
    }
  entryBegin[se_count] = elf.GetDynamicEntryPosition(count);

  // The data are to be written over the old table entries starting at
  // the first one being removed.
  bytesBegin = entryBegin[0];
  unsigned long bytesEnd = entryBegin[se_count];

  // Allocate a buffer to hold the part of the file to be written.
  // Initialize it with zeros.
  bytes.resize(bytesEnd - bytesBegin, 0);

  // Read the part of the DYNAMIC section header that will move.
  // The remainder of the buffer will be left with zeros which
  // represent a DT_NULL entry.
  char* data = &bytes[0];
  for(int i=0; i < se_count; ++i)
    {
    // Read data between the entries being removed.
    unsigned long sz = entryBegin[i+1] - entryEnd[i];
    if(sz > 0 && !elf.ReadBytes(entryEnd[i], sz, data))
      {
      if(emsg)
        {
        *emsg = "Failed to read DYNAMIC section header.";
        }
      return false;
      }
    data += sz;
    }
  }

  // Open the file for update.
  cmsys::ofstream f(file.c_str(),
                  std::ios::in | std::ios::out | std::ios::binary);
  if(!f)
    {
    if(emsg)
      {
      *emsg = "Error opening file for update.";
      }
    return false;
    }

  // Write the new DYNAMIC table header.
  if(!f.seekp(bytesBegin))
    {
    if(emsg)
      {
      *emsg = "Error seeking to DYNAMIC table header for RPATH.";
      }
    return false;
    }
  if(!f.write(&bytes[0], bytes.size()))
    {
    if(emsg)
      {
      *emsg = "Error replacing DYNAMIC table header.";
      }
    return false;
    }

  // Fill the RPATH and RUNPATH strings with zero bytes.
  for(int i=0; i < zeroCount; ++i)
    {
    if(!f.seekp(zeroPosition[i]))
      {
      if(emsg)
        {
        *emsg = "Error seeking to RPATH position.";
        }
      return false;
      }
    for(unsigned long j=0; j < zeroSize[i]; ++j)
      {
      f << '\0';
      }
    if(!f)
      {
      if(emsg)
        {
        *emsg = "Error writing the empty rpath string to the file.";
        }
      return false;
      }
    }

  // Everything was updated successfully.
  if(removed)
    {
    *removed = true;
    }
  return true;
#else
  (void)file;
  (void)emsg;
  (void)removed;
  return false;
#endif
}